

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permutation.cpp
# Opt level: O0

void __thiscall Permutation::Permutation(Permutation *this,int n)

{
  iterator __first;
  iterator __last;
  allocator<int> local_15;
  int local_14;
  Permutation *pPStack_10;
  int n_local;
  Permutation *this_local;
  
  local_14 = n;
  pPStack_10 = this;
  std::allocator<int>::allocator(&local_15);
  std::vector<int,_std::allocator<int>_>::vector(&this->permutation_,(long)n,&local_15);
  std::allocator<int>::~allocator(&local_15);
  __first = std::vector<int,_std::allocator<int>_>::begin(&this->permutation_);
  __last = std::vector<int,_std::allocator<int>_>::end(&this->permutation_);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current,0)
  ;
  return;
}

Assistant:

Permutation::Permutation(int n)
  : permutation_(n) {
  std::iota(permutation_.begin(), permutation_.end(), 0);
}